

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

void __thiscall MeCab::ChunkFreeList<char>::~ChunkFreeList(ChunkFreeList<char> *this)

{
  pointer ppVar1;
  ulong uVar2;
  pointer ppVar3;
  
  this->_vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_00172ab8;
  this->li_ = 0;
  ppVar3 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar3) {
    uVar2 = 0;
    do {
      if (ppVar3[uVar2].second != (char *)0x0) {
        operator_delete__(ppVar3[uVar2].second);
        uVar2 = this->li_;
        ppVar3 = (this->freelist_).
                 super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = (this->freelist_).
                 super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar2 = uVar2 + 1;
      this->li_ = uVar2;
    } while (uVar2 < (ulong)((long)ppVar1 - (long)ppVar3 >> 4));
  }
  if (ppVar3 != (pointer)0x0) {
    operator_delete(ppVar3);
    return;
  }
  return;
}

Assistant:

virtual ~ChunkFreeList() {
    for (li_ = 0; li_ < freelist_.size(); li_++)
      delete [] freelist_[li_].second;
  }